

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O1

void __thiscall
Disa::Vector_Dense<double,_2UL>::Vector_Dense
          (Vector_Dense<double,_2UL> *this,initializer_list<double> *list)

{
  iterator pdVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  initializer_list<double> *__range2;
  size_type *local_100;
  size_type local_f8;
  size_type local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (list->_M_len == 2) {
    pdVar1 = list->_M_array;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)(this->super_array<double,_2UL>)._M_elems + lVar5) =
           *(undefined8 *)((long)pdVar1 + lVar5);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x10);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00185660;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__cxx11::to_string(&local_a0,list->_M_len);
  std::operator+(&local_80,"Initializer list of incorrect size, ",&local_a0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80," vs. ");
  local_e0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == paVar4) {
    local_e0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_e0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_c0,2);
  std::operator+(&local_60,&local_e0,&local_c0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_60,".");
  local_100 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100 == paVar4) {
    local_f0 = paVar4->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_100 = &local_f0;
  }
  else {
    local_f0 = paVar4->_M_allocated_capacity;
  }
  local_f8 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_100,local_f8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

Vector_Dense(const std::initializer_list<_type>& list) {
    ASSERT_DEBUG(list.size() == _size, "Initializer list of incorrect size, " + std::to_string(list.size()) + " vs. " +
                                       std::to_string(_size) + ".");
    auto iter = this->begin();
    FOR_EACH(item, list)* iter++ = item;
  }